

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_new(runtime_type *this,var *b)

{
  bool bVar1;
  runtime_error *this_00;
  proxy *in_RDI;
  any *in_stack_00000010;
  string *in_stack_ffffffffffffff88;
  any *in_stack_ffffffffffffff90;
  function<cs_impl::any_()> *in_stack_ffffffffffffff98;
  allocator *paVar2;
  proxy *this_01;
  allocator local_39;
  string local_38 [56];
  
  this_01 = in_RDI;
  cs_impl::any::type(in_stack_ffffffffffffff90);
  bVar1 = std::type_info::operator==((type_info *)this_01,(type_info *)in_stack_ffffffffffffff98);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    paVar2 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Unsupported operator operations(New).",paVar2);
    runtime_error::runtime_error(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  cs_impl::any::const_val<cs::type_t>(in_stack_00000010);
  std::function<cs_impl::any_()>::operator()(in_stack_ffffffffffffff98);
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_new(const var &b)
	{
		if (b.type() == typeid(type_t))
			return b.const_val<type_t>().constructor();
		else
			throw runtime_error("Unsupported operator operations(New).");
	}